

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall jsonnet::internal::anon_unknown_0::Frame::mark(Frame *this,Heap *heap)

{
  Value v;
  Value v_00;
  bool bVar1;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_RDI;
  HeapThunk **th;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *__range3_2;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>
  *el;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *__range3_1;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>
  *bind;
  const_iterator __end3;
  const_iterator __begin3;
  BindingFrame *__range3;
  HeapEntity *in_stack_00000178;
  Heap *in_stack_00000180;
  Heap *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  anon_union_8_3_4e909c26_for_v in_stack_ffffffffffffff80;
  _Self local_68;
  _Self local_60;
  size_t *local_58;
  reference local_50;
  _Self local_48;
  _Self local_40;
  _Base_ptr *local_38;
  undefined8 local_30;
  _Base_ptr local_28;
  size_t local_20;
  undefined8 local_18;
  
  local_20 = in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_18 = *(undefined8 *)&in_RDI[2]._M_t._M_impl;
  v.v.h = in_stack_ffffffffffffff80.h;
  v._0_8_ = in_stack_ffffffffffffff78;
  Heap::markFrom(in_stack_ffffffffffffff70,v);
  local_30 = *(undefined8 *)&in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header;
  local_28 = in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  v_00.v.h = in_stack_ffffffffffffff80.h;
  v_00._0_8_ = in_stack_ffffffffffffff78;
  Heap::markFrom(in_stack_ffffffffffffff70,v_00);
  if (in_RDI[6]._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    Heap::markFrom(in_stack_00000180,in_stack_00000178);
  }
  if (*(long *)&in_RDI[7]._M_t._M_impl != 0) {
    Heap::markFrom(in_stack_00000180,in_stack_00000178);
  }
  local_38 = &in_RDI[7]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
       ::begin(in_RDI);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    local_50 = std::
               _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                            *)in_stack_ffffffffffffff70);
    Heap::markFrom(in_stack_00000180,in_stack_00000178);
    std::
    _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                  *)in_stack_ffffffffffffff70);
  }
  local_58 = &in_RDI[3]._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
       ::begin(in_RDI);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_60,&local_68);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 *)in_stack_ffffffffffffff70);
    Heap::markFrom(in_stack_00000180,in_stack_00000178);
    std::
    _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                  *)in_stack_ffffffffffffff70);
  }
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::begin((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
           *)in_RDI);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::end((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
         *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*const_*,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*const_*,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffff70 =
         (Heap *)__gnu_cxx::
                 __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*const_*,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                 ::operator*((__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*const_*,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                              *)&stack0xffffffffffffff80);
    Heap::markFrom(in_stack_00000180,in_stack_00000178);
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*const_*,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::operator++((__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*const_*,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)&stack0xffffffffffffff80);
  }
  return;
}

Assistant:

void mark(Heap &heap) const
    {
        heap.markFrom(val);
        heap.markFrom(val2);
        if (context)
            heap.markFrom(context);
        if (self)
            heap.markFrom(self);
        for (const auto &bind : bindings)
            heap.markFrom(bind.second);
        for (const auto &el : elements)
            heap.markFrom(el.second);
        for (const auto &th : thunks)
            heap.markFrom(th);
    }